

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O3

void draw_handle(int left,int top,bool filled,Am_Drawonable *draw,Am_Style *style,
                Am_Object *handle_obj)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  Am_Object *this;
  Am_Value *value;
  Am_Style *this_00;
  Am_Object local_48;
  Am_Draw_Method draw_poly;
  
  bVar1 = Am_Object::Valid(handle_obj);
  if (bVar1) {
    this_00 = &Am_No_Style;
    if (!filled) {
      style = &Am_No_Style;
      this_00 = &Am_White;
    }
    pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(style);
    this = Am_Object::Set(handle_obj,0x6a,pAVar2,0);
    pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(this_00);
    Am_Object::Set(this,0x6b,pAVar2,0);
    value = Am_Object::Get(handle_obj,2000,0);
    Am_Draw_Method::Am_Draw_Method(&draw_poly,value);
    Am_Object::Am_Object(&local_48,handle_obj);
    (*draw_poly.Call)((Am_Object_Data *)&local_48,draw,left,top);
    Am_Object::~Am_Object(&local_48);
  }
  else if (filled) {
    (*draw->_vptr_Am_Drawonable[0x2c])(draw,&Am_No_Style,style,left,(ulong)(uint)top,0xd,0xd,0);
    (*draw->_vptr_Am_Drawonable[0x2c])(draw,&Am_White,&Am_No_Style,left,(ulong)(uint)top,0xd,0xd,0);
  }
  else {
    (*draw->_vptr_Am_Drawonable[0x2c])(draw,style,&Am_No_Style,left,(ulong)(uint)top,0xd,0xd,0);
  }
  return;
}

Assistant:

void
draw_handle(int left, int top, bool filled, Am_Drawonable *draw, Am_Style style,
            Am_Object &handle_obj //supports multiple users
            )
{
  if (handle_obj.Valid()) {
    // we have something other than rect to draw

    if (filled) {
      handle_obj.Set(Am_FILL_STYLE, style).Set(Am_LINE_STYLE, Am_No_Style);
    } else {
      handle_obj.Set(Am_FILL_STYLE, Am_No_Style).Set(Am_LINE_STYLE, Am_White);
    }
    Am_Draw_Method draw_poly = handle_obj.Get(Am_DRAW_METHOD);
    draw_poly.Call(handle_obj, draw, left, top);
  } else {
    if (filled) {
      draw->Draw_Rectangle(Am_No_Style, style, left, top, HANDLE_SIZE,
                           HANDLE_SIZE);
      //outline in white
      draw->Draw_Rectangle(Am_White, Am_No_Style, left, top, HANDLE_SIZE,
                           HANDLE_SIZE);
    } else
      draw->Draw_Rectangle(style, Am_No_Style, left, top, HANDLE_SIZE,
                           HANDLE_SIZE);
  }
}